

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void CheckValign(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Bool BVar1;
  ctmbstr local_98;
  ctmbstr valuesp [5];
  char *local_68;
  ctmbstr values2 [3];
  ctmbstr local_48;
  ctmbstr values [5];
  AttVal *attval_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  values[4] = (ctmbstr)attval;
  memcpy(&local_48,&DAT_001ee910,0x28);
  local_68 = "left";
  values2[0] = "right";
  values2[1] = (ctmbstr)0x0;
  memcpy(&local_98,&PTR_anon_var_dwarf_215e2_001ee960,0x28);
  if ((values[4] == (ctmbstr)0x0) || (*(long *)(values[4] + 0x30) == 0)) {
    prvTidyReportAttrError(doc,node,(AttVal *)values[4],0x256);
  }
  else {
    CheckLowerCaseAttrValue(doc,node,(AttVal *)values[4]);
    BVar1 = AttrValueIsAmong((AttVal *)values[4],&local_48);
    if (BVar1 == no) {
      BVar1 = AttrValueIsAmong((AttVal *)values[4],&local_68);
      if (BVar1 == no) {
        BVar1 = AttrValueIsAmong((AttVal *)values[4],&local_98);
        if (BVar1 == no) {
          prvTidyReportAttrError(doc,node,(AttVal *)values[4],0x22b);
        }
        else {
          prvTidyConstrainVersion(doc,0xe000);
          prvTidyReportAttrError(doc,node,(AttVal *)values[4],0x26e);
        }
      }
      else if ((node->tag == (Dict *)0x0) || ((node->tag->model & 0x10000) == 0)) {
        prvTidyReportAttrError(doc,node,(AttVal *)values[4],0x22b);
      }
    }
  }
  return;
}

Assistant:

void CheckValign( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    ctmbstr const values[] = {"top", "middle", "bottom", "baseline", NULL};
    ctmbstr const values2[] = {"left", "right", NULL};
    ctmbstr const valuesp[] = {"texttop", "absmiddle", "absbottom",
                               "textbottom", NULL};

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    CheckLowerCaseAttrValue( doc, node, attval );

    if (AttrValueIsAmong(attval, values))
    {
            /* all is fine */
    }
    else if (AttrValueIsAmong(attval, values2))
    {
        if (!(node->tag && (node->tag->model & CM_IMG)))
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }
    else if (AttrValueIsAmong(attval, valuesp))
    {
        TY_(ConstrainVersion)( doc, VERS_PROPRIETARY );
        TY_(ReportAttrError)( doc, node, attval, PROPRIETARY_ATTR_VALUE);
    }
    else
        TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
}